

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_JUnitOutputTest_testFailuresInSeparateGroups_TestShell::createTest
          (TEST_JUnitOutputTest_testFailuresInSeparateGroups_TestShell *this)

{
  TEST_JUnitOutputTest_testFailuresInSeparateGroups_Test *this_00;
  TEST_JUnitOutputTest_testFailuresInSeparateGroups_TestShell *this_local;
  
  this_00 = (TEST_JUnitOutputTest_testFailuresInSeparateGroups_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x25b);
  TEST_JUnitOutputTest_testFailuresInSeparateGroups_Test::
  TEST_JUnitOutputTest_testFailuresInSeparateGroups_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, testFailuresInSeparateGroups)
{
    testCaseRunner->start()
            .withGroup("testGroup")
                .withTest("passingOne")
                .withTest("FailingTest").thatFails("Failure", "file", 99)
            .withGroup("AnotherGroup")
                .withTest("AnotherFailingTest").thatFails("otherFailure", "anotherFile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroup.xml");

    STRCMP_EQUAL("<failure message=\"file:99: Failure\" type=\"AssertionFailedError\">\n", outputFile->line(8));

    outputFile = fileSystem.file("cpputest_AnotherGroup.xml");
    STRCMP_EQUAL("<failure message=\"anotherFile:10: otherFailure\" type=\"AssertionFailedError\">\n", outputFile->line(8));
}